

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void Qentem::QTest::PrintInfo(void)

{
  char local_21;
  unsigned_long local_20;
  char *local_18;
  char *local_10;
  
  local_10 = TestOutPut::GetColor(TITLE);
  local_18 = TestOutPut::GetColor(END);
  TestOutPut::Print<char_const*,char[15],char_const*,char[3]>
            (&local_10,(char (*) [15])"Configurations",&local_18,(char (*) [3])0x1253af);
  TestOutPut::Print<char[14]>((char (*) [14])"Arch: 64-bit\n");
  local_20 = 4;
  TestOutPut::Print<char[8],unsigned_long,char[9]>
            ((char (*) [8])"SizeT: ",&local_20,(char (*) [9])" bytes:\n");
  TestOutPut::Print<char[27]>((char (*) [27])"Endianness: Little-Endian\n");
  TestOutPut::Print<char[33]>((char (*) [33])"Streaming SIMD Extensions 2: On\n");
  TestOutPut::Print<char[22]>((char (*) [22])"Auto Escape HTML: On\n");
  local_21 = '\n';
  TestOutPut::Print<char>(&local_21);
  return;
}

Assistant:

QENTEM_NOINLINE static void PrintInfo() {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), "Configurations",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ":\n");
        if QENTEM_CONST_EXPRESSION (Config::Is64bit) {
            TestOutPut::Print("Arch: 64-bit\n");
        } else {
            TestOutPut::Print("Arch: 32-bit\n");
        }

        TestOutPut::Print("SizeT: ", sizeof(SizeT), " bytes:\n");

        if QENTEM_CONST_EXPRESSION (Config::IsBigEndian) {
            TestOutPut::Print("Endianness: Big-Endian\n");
        } else {
            TestOutPut::Print("Endianness: Little-Endian\n");
        }
#if defined(QENTEM_AVX2) && (QENTEM_AVX2 == 1)
        TestOutPut::Print("Advanced Vector Extensions: On\n");
#endif

#if defined(QENTEM_SSE2) && (QENTEM_SSE2 == 1)
        TestOutPut::Print("Streaming SIMD Extensions 2: On\n");
#endif

#if defined(QENTEM_MSIMD128) && (QENTEM_MSIMD128 == 1)
        TestOutPut::Print("WASM SIMD128: On\n");
#endif

        if QENTEM_CONST_EXPRESSION (Config::AutoEscapeHTML) {
            TestOutPut::Print("Auto Escape HTML: On\n");
        }

        TestOutPut::Print('\n');
    }